

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O3

spv_result_t spvtools::val::CapabilityPass(ValidationState_t *_,Instruction *inst)

{
  uint capability;
  spv_target_env sVar1;
  pointer psVar2;
  pointer puVar3;
  ValidationState_t *pVVar4;
  bool bVar5;
  size_t sVar6;
  long lVar7;
  spv_result_t sVar8;
  char *pcVar9;
  ulong uVar10;
  string opencl_profile;
  long *local_250;
  long local_248;
  long local_240 [2];
  ValidationState_t *local_230;
  string local_228;
  DiagnosticStream local_208;
  
  if ((inst->inst_).opcode != 0x11) {
    return SPV_SUCCESS;
  }
  psVar2 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(inst->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)psVar2 != 0x10) {
    __assert_fail("inst->operands().size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x124,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  if (psVar2->num_words != 1) {
    __assert_fail("operand.num_words == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x128,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <=
      (ulong)psVar2->offset) {
    __assert_fail("operand.offset < inst->words().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0x129,
                  "spv_result_t spvtools::val::CapabilityPass(ValidationState_t &, const Instruction *)"
                 );
  }
  capability = puVar3[psVar2->offset];
  uVar10 = (ulong)capability;
  sVar1 = _->context_->target_env;
  if ((sVar1 < SPV_ENV_UNIVERSAL_1_3) &&
     ((0x1d000U >> (sVar1 & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) != 0)) {
    pcVar9 = "Embedded";
    bVar5 = true;
  }
  else {
    pcVar9 = "Full";
    bVar5 = false;
  }
  local_250 = local_240;
  local_230 = _;
  sVar6 = strlen(pcVar9);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,pcVar9,pcVar9 + sVar6);
  pVVar4 = local_230;
  if (sVar1 == SPV_ENV_VULKAN_1_2) {
    sVar8 = SPV_SUCCESS;
    if ((capability < 0x34) && ((0xcd90000000003U >> (uVar10 & 0x3f) & 1) != 0)) goto LAB_001a7d1f;
    if (((uVar10 == 0x14b5) ||
        (((capability - 0x1155 & 0xfffffffd) == 0 ||
         (bVar5 = anon_unknown_2::IsSupportOptionalVulkan_1_1(capability), pVVar4 = local_230, bVar5
         )))) || (((capability - 0x14b6 < 0x2e &&
                   ((0x3800000007fdU >> ((ulong)(capability - 0x14b6) & 0x3f) & 1) != 0)) ||
                  ((((capability - 0x1160 < 0x15 &&
                     ((0x1f0007U >> (capability - 0x1160 & 0x1f) & 1) != 0)) ||
                    (capability - 0x45 < 2)) ||
                   (bVar5 = anon_unknown_2::IsEnabledByExtension(local_230,capability), bVar5))))))
    goto LAB_001a7d24;
    ValidationState_t::diag(&local_208,pVVar4,SPV_ERROR_INVALID_CAPABILITY,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Capability ",0xb);
    CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
    operator()[abi_cxx11_(&local_228,pVVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    pcVar9 = " is not allowed by Vulkan 1.2 specification";
LAB_001a7cb0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar9,0x2b);
    pcVar9 = " (or requires extension)";
    lVar7 = 0x18;
  }
  else {
    if (sVar1 == SPV_ENV_VULKAN_1_1) {
      sVar8 = SPV_SUCCESS;
      if ((capability < 0x34) && ((0xcd90000000003U >> (uVar10 & 0x3f) & 1) != 0))
      goto LAB_001a7d1f;
      if (((capability - 0x1155 & 0xfffffffd) == 0) ||
         ((bVar5 = anon_unknown_2::IsSupportOptionalVulkan_1_1(capability), pVVar4 = local_230,
          bVar5 || (bVar5 = anon_unknown_2::IsEnabledByExtension(local_230,capability), bVar5))))
      goto LAB_001a7d24;
      ValidationState_t::diag(&local_208,pVVar4,SPV_ERROR_INVALID_CAPABILITY,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Capability ",0xb);
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_228,pVVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      pcVar9 = " is not allowed by Vulkan 1.1 specification";
      goto LAB_001a7cb0;
    }
    if (sVar1 == SPV_ENV_VULKAN_1_0) {
      if ((capability < 0x3a) && ((0x3ffff8ffbc01e0fU >> (uVar10 & 0x3f) & 1) != 0))
      goto LAB_001a7d1f;
      bVar5 = anon_unknown_2::IsEnabledByExtension(local_230,capability);
      if (bVar5) {
        sVar8 = SPV_SUCCESS;
        goto LAB_001a7d24;
      }
      ValidationState_t::diag(&local_208,pVVar4,SPV_ERROR_INVALID_CAPABILITY,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Capability ",0xb);
      CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
      operator()[abi_cxx11_(&local_228,pVVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      pcVar9 = " is not allowed by Vulkan 1.0 specification";
      goto LAB_001a7cb0;
    }
    sVar8 = SPV_SUCCESS;
    if (1 < sVar1 - SPV_ENV_OPENCL_1_2) {
      if (sVar1 < SPV_ENV_UNIVERSAL_1_3) {
        if ((0xe008U >> (sVar1 & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) == 0) {
          if ((0x10010U >> (sVar1 & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) != 0) {
            if (capability < 0x28) {
              if ((0xc0004e01f0U >> (uVar10 & 0x3f) & 1) == 0) {
                if (uVar10 != 0xb) goto LAB_001a7d61;
                if (!bVar5) goto LAB_001a7d24;
                goto LAB_001a7d7d;
              }
            }
            else {
LAB_001a7d61:
              if ((capability - 0x3a & 0xfffffffd) != 0) {
                if ((uVar10 == 10) || (capability == 0xd)) goto LAB_001a7d24;
LAB_001a7d7d:
                bVar5 = anon_unknown_2::IsEnabledByExtension(local_230,capability);
                if ((bVar5) ||
                   (((bVar5 = EnumSet<spv::Capability>::contains
                                        (&pVVar4->module_capabilities_,CapabilityImageBasic), bVar5
                     && (capability < 0x30)) && ((0xd80000104000U >> (uVar10 & 0x3f) & 1) != 0))))
                goto LAB_001a7d24;
                ValidationState_t::diag(&local_208,pVVar4,SPV_ERROR_INVALID_CAPABILITY,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Capability ",0xb);
                CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)
                ::$_0::operator()[abi_cxx11_(&local_228,pVVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_228._M_dataplus._M_p,
                           local_228._M_string_length);
                pcVar9 = " is not allowed by OpenCL 2.2 ";
                goto LAB_001a7afc;
              }
            }
          }
        }
        else if (((0x27 < capability) ||
                 (((0xc0004e25f0U >> (uVar10 & 0x3f) & 1) == 0 && ((uVar10 != 0xb || (bVar5)))))) &&
                (bVar5 = anon_unknown_2::IsEnabledByExtension(local_230,capability), !bVar5)) {
          bVar5 = EnumSet<spv::Capability>::contains
                            (&pVVar4->module_capabilities_,CapabilityImageBasic);
          if (((bVar5) && (capability < 0x30)) && ((0xd80000104000U >> (uVar10 & 0x3f) & 1) != 0))
          goto LAB_001a7d24;
          ValidationState_t::diag(&local_208,pVVar4,SPV_ERROR_INVALID_CAPABILITY,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Capability ",0xb);
          CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
          operator()[abi_cxx11_(&local_228,pVVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
          pcVar9 = " is not allowed by OpenCL 2.0/2.1 ";
          lVar7 = 0x22;
          goto LAB_001a7c1f;
        }
      }
LAB_001a7d1f:
      sVar8 = SPV_SUCCESS;
      goto LAB_001a7d24;
    }
    if (((capability < 0x28) &&
        (((0x80004025f0U >> (uVar10 & 0x3f) & 1) != 0 || ((uVar10 == 0xb && (!bVar5)))))) ||
       (bVar5 = anon_unknown_2::IsEnabledByExtension(local_230,capability), bVar5))
    goto LAB_001a7d1f;
    bVar5 = EnumSet<spv::Capability>::contains(&pVVar4->module_capabilities_,CapabilityImageBasic);
    if (((bVar5) && (capability < 0x30)) && ((0xd80000100000U >> (uVar10 & 0x3f) & 1) != 0))
    goto LAB_001a7d24;
    ValidationState_t::diag(&local_208,pVVar4,SPV_ERROR_INVALID_CAPABILITY,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Capability ",0xb);
    CapabilityPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_0::
    operator()[abi_cxx11_(&local_228,pVVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    pcVar9 = " is not allowed by OpenCL 1.2 ";
LAB_001a7afc:
    lVar7 = 0x1e;
LAB_001a7c1f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar9,lVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,(char *)local_250,local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," Profile specification",0x16);
    pcVar9 = " (or requires extension or capability)";
    lVar7 = 0x26;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar9,lVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
  sVar8 = local_208.error_;
LAB_001a7d24:
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  return sVar8;
}

Assistant:

spv_result_t CapabilityPass(ValidationState_t& _, const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpCapability) return SPV_SUCCESS;

  assert(inst->operands().size() == 1);

  const spv_parsed_operand_t& operand = inst->operand(0);

  assert(operand.num_words == 1);
  assert(operand.offset < inst->words().size());

  const uint32_t capability = inst->word(operand.offset);
  const auto capability_str = [&_, capability]() {
    spv_operand_desc desc = nullptr;
    if (_.grammar().lookupOperand(SPV_OPERAND_TYPE_CAPABILITY, capability,
                                  &desc) != SPV_SUCCESS ||
        !desc) {
      return std::string("Unknown");
    }
    return std::string(desc->name);
  };

  const auto env = _.context()->target_env;
  const bool opencl_embedded = env == SPV_ENV_OPENCL_EMBEDDED_1_2 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_0 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_1 ||
                               env == SPV_ENV_OPENCL_EMBEDDED_2_2;
  const std::string opencl_profile = opencl_embedded ? "Embedded" : "Full";
  if (env == SPV_ENV_VULKAN_1_0) {
    if (!IsSupportGuaranteedVulkan_1_0(capability) &&
        !IsSupportOptionalVulkan_1_0(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.0 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_VULKAN_1_1) {
    if (!IsSupportGuaranteedVulkan_1_1(capability) &&
        !IsSupportOptionalVulkan_1_1(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.1 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_VULKAN_1_2) {
    if (!IsSupportGuaranteedVulkan_1_2(capability) &&
        !IsSupportOptionalVulkan_1_2(capability) &&
        !IsEnabledByExtension(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by Vulkan 1.2 specification"
             << " (or requires extension)";
    }
  } else if (env == SPV_ENV_OPENCL_1_2 || env == SPV_ENV_OPENCL_EMBEDDED_1_2) {
    if (!IsSupportGuaranteedOpenCL_1_2(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_1_2(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 1.2 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  } else if (env == SPV_ENV_OPENCL_2_0 || env == SPV_ENV_OPENCL_EMBEDDED_2_0 ||
             env == SPV_ENV_OPENCL_2_1 || env == SPV_ENV_OPENCL_EMBEDDED_2_1) {
    if (!IsSupportGuaranteedOpenCL_2_0(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_2_0(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 2.0/2.1 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  } else if (env == SPV_ENV_OPENCL_2_2 || env == SPV_ENV_OPENCL_EMBEDDED_2_2) {
    if (!IsSupportGuaranteedOpenCL_2_2(capability, opencl_embedded) &&
        !IsSupportOptionalOpenCL_1_2(capability) &&
        !IsEnabledByExtension(_, capability) &&
        !IsEnabledByCapabilityOpenCL_2_0(_, capability)) {
      return _.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
             << "Capability " << capability_str()
             << " is not allowed by OpenCL 2.2 " << opencl_profile
             << " Profile specification"
             << " (or requires extension or capability)";
    }
  }

  return SPV_SUCCESS;
}